

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O3

void __thiscall FIX44::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  long *plVar1;
  atomic<long> *counter;
  message_order local_30 [8];
  undefined8 local_28;
  long *plStack_20;
  
  FIX::message_order::message_order
            (local_30,0x37,0x41,0x30,0x16,0x1cc,0x1cd,0xa7,0x2fa,200,0x21d,0xc9,0xe0,0xe1,0xef,0xe2,
             0xe3,0xe4,0xff,0x21f,0x1d6,0x1d7,0x1d8,0xf0,0xca,0x3b3,0xce,0xe7,0xdf,0xcf,0x6a,0x15c,
             0x15d,0x6b,0x15e,0x15f,0x2b3,0x29b,0x36b,0x36c,0x369,0x36a,0x2c7,0x22b,0);
  FIX::FieldMap::FieldMap((FieldMap *)this,local_30);
  plVar1 = plStack_20;
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00152848;
  (this->super_Group).m_field = 0x92;
  (this->super_Group).m_delim = 0x37;
  if (plStack_20 != (long *)0x0) {
    LOCK();
    *plStack_20 = *plStack_20 + -1;
    UNLOCK();
    if (*plStack_20 == 0) {
      local_28 = 0;
      plStack_20 = (long *)0x0;
      if (plVar1 != (long *)0x0) {
        operator_delete__(plVar1);
      }
    }
  }
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00152980;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,460,461,167,762,200,541,201,224,225,239,226,227,228,255,543,470,471,472,240,202,947,206,231,223,207,106,348,349,107,350,351,691,667,875,876,873,874,711,555,0)) {}